

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effect3d.cpp
# Opt level: O1

int __thiscall
LREffect::draw(LREffect *this,Mat *image,vector<Object,_std::allocator<Object>_> *objects)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  ostream *poVar5;
  undefined8 uVar6;
  undefined8 extraout_RAX;
  int iVar7;
  pointer pOVar8;
  long lVar9;
  ulong uVar10;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> points;
  void *local_d8;
  Mat *pMStack_d0;
  long local_c8;
  ulong local_c0;
  Point_<int> local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ulong local_98;
  int local_90;
  int local_8c;
  int local_88 [4];
  Mat *local_78;
  undefined8 uStack_70;
  vector<Object,_std::allocator<Object>_> *local_68;
  undefined8 local_60;
  undefined8 local_58;
  int local_50;
  int local_4c;
  int local_48 [3];
  int local_3c;
  uint local_38 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"----Left to right effect----",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  local_48[2] = *(int *)(image + 0xc) / 3;
  iVar2 = local_48[2] * 2;
  pOVar8 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_68 = objects;
  if ((objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.super__Vector_impl_data
      ._M_finish != pOVar8) {
    local_98 = 0;
    uVar10 = 0;
    local_c0 = (ulong)(uint)local_48[2];
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"obj.prob ",9);
      poVar5 = std::ostream::_M_insert<double>((double)pOVar8[uVar10].prob);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if (0.5 < pOVar8[uVar10].prob || pOVar8[uVar10].prob == 0.5) {
        local_d8 = (void *)0x0;
        pMStack_d0 = (Mat *)0x0;
        local_c8 = 0;
        local_b8.y = 1;
        local_b8.x = (int)local_c0;
        std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<cv::Point_<int>>
                  ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&local_d8,&local_b8);
        uVar4 = local_c0;
        iVar7 = *(int *)(image + 8);
        if (0 < iVar7) {
          lVar9 = 0;
          bVar3 = false;
          do {
            cVar1 = *(char *)((long)local_48[2] +
                             **(long **)&pOVar8[uVar10].field_0x78 * lVar9 +
                             *(long *)&pOVar8[uVar10].field_0x40);
            if (cVar1 == '\0') {
              if (bVar3) {
                local_b8.y = (int)lVar9;
                local_b8.x = (int)uVar4;
                std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
                emplace_back<cv::Point_<int>>
                          ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&local_d8,
                           &local_b8);
                bVar3 = false;
              }
            }
            else if ((cVar1 == -1) && (!bVar3)) {
              local_b8.y = (int)lVar9;
              local_b8.x = (int)uVar4;
              std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
              emplace_back<cv::Point_<int>>
                        ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&local_d8,
                         &local_b8);
              bVar3 = true;
            }
            lVar9 = lVar9 + 1;
            iVar7 = *(int *)(image + 8);
          } while (lVar9 < iVar7);
        }
        local_b8.y = iVar7 + -1;
        local_b8.x = (int)local_c0;
        std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<cv::Point_<int>>
                  ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&local_d8,&local_b8);
        if (0 < (int)((ulong)((long)pMStack_d0 - (long)local_d8) >> 3)) {
          lVar9 = 0;
          do {
            uStack_70 = 0;
            local_88[2] = 0x3010000;
            local_58 = *(undefined8 *)((long)local_d8 + lVar9 * 8);
            local_60 = *(undefined8 *)((long)local_d8 + lVar9 * 8 + 8);
            local_b8.x = 0;
            local_b8.y = 0x406fe000;
            uStack_b0 = 0x406fe00000000000;
            local_a8 = 0x406fe00000000000;
            uStack_a0 = 0;
            local_78 = image;
            cv::line(local_88 + 2,&local_58,&local_60,&local_b8,4,0xffffffff,0);
            lVar9 = lVar9 + 2;
          } while ((int)lVar9 < (int)((ulong)((long)pMStack_d0 - (long)local_d8) >> 3));
        }
        uStack_70 = 0;
        local_88[2] = 0x3010000;
        local_88[1] = 1;
        local_8c = *(int *)(image + 8) + -1;
        local_b8.x = 0;
        local_b8.y = 0x406fe000;
        uStack_b0 = 0x406fe00000000000;
        local_a8 = 0x406fe00000000000;
        uStack_a0 = 0;
        local_90 = iVar2;
        local_88[0] = iVar2;
        local_78 = image;
        uVar6 = cv::line(local_88 + 2,local_88,&local_90,&local_b8,4,0xffffffff,0);
        if (local_d8 != (void *)0x0) {
          operator_delete(local_d8,local_c8 - (long)local_d8);
          uVar6 = extraout_RAX;
        }
        local_98 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
      }
      uVar10 = uVar10 + 1;
      pOVar8 = (local_68->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)(((long)(local_68->super__Vector_base<Object,_std::allocator<Object>_>)
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar8 >> 4)
                             * -0x71c71c71c71c71c7));
    local_48[2] = (int)local_c0;
    if ((local_98 & 1) != 0) {
      return 0;
    }
  }
  local_c8 = 0;
  local_d8._0_4_ = 0x3010000;
  local_38[1] = 1;
  local_3c = *(int *)(image + 8) + -1;
  local_b8.x = 0;
  local_b8.y = 0x406fe000;
  uStack_b0 = 0x406fe00000000000;
  local_a8 = 0x406fe00000000000;
  uStack_a0 = 0;
  pMStack_d0 = image;
  local_38[0] = local_48[2];
  cv::line(&local_d8,local_38,local_48 + 2,&local_b8,4,0xffffffff,0);
  local_c8 = 0;
  local_d8 = (void *)CONCAT44(local_d8._4_4_,0x3010000);
  local_48[1] = 1;
  local_4c = *(int *)(image + 8) + -1;
  local_b8.x = 0;
  local_b8.y = 0x406fe000;
  uStack_b0 = 0x406fe00000000000;
  local_a8 = 0x406fe00000000000;
  uStack_a0 = 0;
  pMStack_d0 = image;
  local_50 = iVar2;
  local_48[0] = iVar2;
  cv::line(&local_d8,local_48,&local_50,&local_b8,4,0xffffffff,0);
  return 0;
}

Assistant:

int LREffect::draw(cv::Mat& image, const std::vector<Object>& objects) 
{
    std::cout << "----Left to right effect----" << std::endl;

    int left_x = image.cols/3;
    int right_x = image.cols/3*2;

    bool has_major_obj = false;

    for (size_t i = 0; i < objects.size(); i++)
    {
        const Object& obj = objects[i];
//            float ratio = obj.rect.area() / (image.rows * image.cols);
        std::cout << "obj.prob " << obj.prob << std::endl;

        if (obj.prob < 0.5 ) 
        {
            continue;
        }

        has_major_obj = true;
        // draw white line

        // left line
        std::vector<cv::Point> points;
        points.emplace_back(cv::Point(left_x, 1));
        bool is_mask = false;

        for (int y = 0; y < image.rows; y++)
        {
            const uchar* mp = obj.mask.ptr(y);
            if (mp[left_x] == 255 && !is_mask)
            {
                is_mask = true;
                points.emplace_back(cv::Point(left_x, y));
            }
            else if (mp[left_x] == 0 && is_mask)
            {
                is_mask = false;
                points.emplace_back(cv::Point(left_x, y));
            }
        }
        points.emplace_back(cv::Point(left_x, image.rows - 1));

        for (int j = 0; j < (int)points.size(); j += 2)
        {
            cv::line(image, points[j], points[j + 1], cv::Scalar(255, 255, 255), 4, -1);
        }

        // right line
        cv::line(image, cv::Point(right_x, 1), cv::Point(right_x, image.rows - 1), cv::Scalar(255,255,255), 4, -1);
    }

    if (!has_major_obj)
    {
        cv::line(image, cv::Point(left_x, 1), cv::Point(left_x, image.rows - 1),
                    cv::Scalar(255,255,255), 4, -1);
        cv::line(image, cv::Point(right_x, 1), cv::Point(right_x, image.rows - 1),
                    cv::Scalar(255,255,255), 4, -1);
    }
    return 0;
}